

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::CreateLocalGenerators(cmGlobalGenerator *this)

{
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  pointer ppcVar1;
  int iVar2;
  cmLocalGenerator *in_RAX;
  undefined4 extraout_var;
  pointer ppcVar3;
  cmLocalGenerator *local_28;
  
  this_00 = &this->LocalGenerators;
  local_28 = in_RAX;
  cmDeleteAll<std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>(this_00);
  ppcVar1 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->LocalGenerators).
    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::reserve
            (this_00,(long)(this->Makefiles).
                           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->Makefiles).
                           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3);
  for (ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar3 !=
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    iVar2 = (*this->_vptr_cmGlobalGenerator[2])(this,*ppcVar3);
    local_28 = (cmLocalGenerator *)CONCAT44(extraout_var,iVar2);
    std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
    emplace_back<cmLocalGenerator*>
              ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)this_00,&local_28);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateLocalGenerators()
{
  cmDeleteAll(this->LocalGenerators);
  this->LocalGenerators.clear();
  this->LocalGenerators.reserve(this->Makefiles.size());
  for (std::vector<cmMakefile*>::const_iterator it = this->Makefiles.begin();
       it != this->Makefiles.end(); ++it) {
    this->LocalGenerators.push_back(this->CreateLocalGenerator(*it));
  }
}